

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<unsigned_int>
          (BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,uint *key)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  ValueNumber VVar4;
  Type this_00;
  int iVar5;
  int *piVar6;
  
  piVar1 = this->buckets;
  if (piVar1 == (Type)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = GetBucket(this,*key * 2 + 1);
    pSVar2 = this->entries;
    piVar6 = piVar1 + uVar3;
    uVar3 = 0;
    while( true ) {
      iVar5 = *piVar6;
      if ((long)iVar5 < 0) break;
      VVar4 = ValueToKey<unsigned_int,_Value_*>::ToKey((Value **)(pSVar2 + iVar5));
      if (VVar4 == *key) {
        this_00 = this->stats;
        goto LAB_0040740e;
      }
      uVar3 = uVar3 + 1;
      piVar6 = &pSVar2[iVar5].
                super_DefaultHashedEntry<unsigned_int,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<unsigned_int,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
                super_ValueEntryData<Value_*>.next;
    }
  }
  this_00 = this->stats;
  iVar5 = -1;
LAB_0040740e:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return iVar5;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }